

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCCompatible.cpp
# Opt level: O2

uchar __thiscall
PCCompatible::IO<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::in<unsigned_char>
          (IO<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1> *this,uint16_t port)

{
  bool bVar1;
  DMA *pDVar2;
  uint8_t uVar3;
  uint uVar4;
  ssize_t sVar5;
  byte *pbVar6;
  void *in_RDX;
  byte bVar7;
  undefined2 in_register_00000032;
  Channel *this_00;
  
  bVar7 = 0xff;
  switch(CONCAT22(in_register_00000032,port)) {
  case 0x40:
    this_00 = this->pit_->channels_;
    break;
  case 0x41:
    this_00 = this->pit_->channels_ + 1;
    break;
  case 0x42:
    this_00 = this->pit_->channels_ + 2;
    break;
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x70:
    goto switchD_0034c25d_caseD_a;
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
    sVar5 = Intel::i8255::i8255<PCCompatible::i8255PortHandler>::read
                      (this->ppi_,CONCAT22(in_register_00000032,port),in_RDX,0x46bb18);
    return (uchar)sVar5;
  case 0x71:
    sVar5 = RTC::read(this->rtc_,CONCAT22(in_register_00000032,port),in_RDX,0x46bb18);
    return (uchar)sVar5;
  default:
    switch(CONCAT22(in_register_00000032,port)) {
    case 0x3da:
      bVar7 = (this->video_->crtc_).bus_state_.display_enable ^ 5U |
              ((this->video_->crtc_).bus_state_.vsync != false) * '\t';
      break;
    case 1000:
    case 0x3e9:
    case 0x3ea:
    case 0x3eb:
    case 0x3ec:
    case 0x3ed:
    case 0x3ee:
    case 0x3ef:
    case 0x3f8:
    case 0x3f9:
    case 0x3fa:
    case 0x3fb:
    case 0x3fc:
    case 0x3fd:
    case 0x3fe:
    case 0x3ff:
      break;
    case 0x3f4:
      bVar7 = (this->fdc_->status_).main_status_;
      break;
    case 0x3f5:
      sVar5 = FloppyController::read(this->fdc_,CONCAT22(in_register_00000032,port),in_RDX,0x46bc00)
      ;
      return (uchar)sVar5;
    default:
      if (CONCAT22(in_register_00000032,port) < 0x22) {
        switch((long)&switchD_0034c25d::switchdataD_0046ba90 +
               (long)(int)(&switchD_0034c25d::switchdataD_0046ba90)
                          [CONCAT22(in_register_00000032,port)]) {
        case 0x34c1ed:
          goto switchD_0034c25d_caseD_a;
        case 0x34c25f:
          pDVar2 = this->dma_;
          bVar1 = (pDVar2->controller).next_access_low_;
          (pDVar2->controller).next_access_low_ = (bool)(bVar1 ^ 1);
          pbVar6 = (byte *)((long)&(pDVar2->controller).channels_._M_elems[0].address +
                           (ulong)(bVar1 == false));
          break;
        case 0x34c2f7:
          pDVar2 = this->dma_;
          bVar1 = (pDVar2->controller).next_access_low_;
          (pDVar2->controller).next_access_low_ = (bool)(bVar1 ^ 1);
          pbVar6 = (byte *)((long)&(pDVar2->controller).channels_._M_elems[3].count +
                           (ulong)(bVar1 == false));
          break;
        case 0x34c310:
          return this->pic_->mask_;
        case 0x34c31c:
          pDVar2 = this->dma_;
          bVar1 = (pDVar2->controller).next_access_low_;
          (pDVar2->controller).next_access_low_ = (bool)(bVar1 ^ 1);
          pbVar6 = (byte *)((long)&(pDVar2->controller).channels_._M_elems[1].count +
                           (ulong)(bVar1 == false));
          break;
        case 0x34c332:
          return '\0';
        case 0x34c336:
          pDVar2 = this->dma_;
          bVar1 = (pDVar2->controller).next_access_low_;
          (pDVar2->controller).next_access_low_ = (bool)(bVar1 ^ 1);
          pbVar6 = (byte *)((long)&(pDVar2->controller).channels_._M_elems[2].count +
                           (ulong)(bVar1 == false));
          break;
        case 0x34c34c:
          pDVar2 = this->dma_;
          bVar1 = (pDVar2->controller).next_access_low_;
          (pDVar2->controller).next_access_low_ = (bool)(bVar1 ^ 1);
          pbVar6 = (byte *)((long)&(pDVar2->controller).channels_._M_elems[0].count +
                           (ulong)(bVar1 == false));
          break;
        case 0x34c362:
          pDVar2 = this->dma_;
          bVar1 = (pDVar2->controller).next_access_low_;
          (pDVar2->controller).next_access_low_ = (bool)(bVar1 ^ 1);
          pbVar6 = (byte *)((long)&(pDVar2->controller).channels_._M_elems[1].address +
                           (ulong)(bVar1 == false));
          break;
        case 0x34c378:
          pDVar2 = this->dma_;
          bVar1 = (pDVar2->controller).next_access_low_;
          (pDVar2->controller).next_access_low_ = (bool)(bVar1 ^ 1);
          pbVar6 = (byte *)((long)&(pDVar2->controller).channels_._M_elems[3].address +
                           (ulong)(bVar1 == false));
          break;
        case 0x34c38e:
          pDVar2 = this->dma_;
          bVar1 = (pDVar2->controller).next_access_low_;
          (pDVar2->controller).next_access_low_ = (bool)(bVar1 ^ 1);
          pbVar6 = (byte *)((long)&(pDVar2->controller).channels_._M_elems[2].address +
                           (ulong)(bVar1 == false));
          break;
        case 0x34c3a4:
          return 0xff;
        case 0x34c3a8:
          uVar3 = i8237::status(&this->dma_->controller);
          return uVar3;
        }
        return *pbVar6;
      }
      uVar4 = CONCAT22(in_register_00000032,port) - 0x2e8;
      if ((uVar4 < 0x18) && ((0xff00ffU >> (uVar4 & 0x1f) & 1) != 0)) {
        return 0xff;
      }
      switch(CONCAT22(in_register_00000032,port)) {
      case 0x80:
        return (this->dma_->pages).pages_[4];
      case 0x81:
        return (this->dma_->pages).pages_[2];
      case 0x82:
        return (this->dma_->pages).pages_[3];
      case 0x83:
        return (this->dma_->pages).pages_[1];
      case 0x84:
        return (this->dma_->pages).pages_[5];
      case 0x85:
        return (this->dma_->pages).pages_[6];
      case 0x86:
        return (this->dma_->pages).pages_[7];
      case 0x87:
        return (this->dma_->pages).pages_[0];
      }
      uVar4 = CONCAT22(in_register_00000032,port) - 0x3b8;
      if ((uVar4 < 7) && ((0x71U >> (uVar4 & 0x1f) & 1) != 0)) {
        return 0xff;
      }
      if (CONCAT22(in_register_00000032,port) - 0x278U < 3) {
        return 0xff;
      }
      if (CONCAT22(in_register_00000032,port) - 0x378U < 3) {
        return 0xff;
      }
      if (CONCAT22(in_register_00000032,port) == 0x201) {
        return 0xff;
      }
    case 0x3db:
    case 0x3dc:
    case 0x3dd:
    case 0x3de:
    case 0x3df:
    case 0x3e0:
    case 0x3e1:
    case 0x3e2:
    case 0x3e3:
    case 0x3e4:
    case 0x3e5:
    case 0x3e6:
    case 999:
    case 0x3f0:
    case 0x3f1:
    case 0x3f2:
    case 0x3f3:
    case 0x3f6:
    case 0x3f7:
switchD_0034c25d_caseD_a:
      printf("Unhandled in: %04x\n");
      return 0xff;
    }
    return bVar7;
  }
  sVar5 = i8253<false,_PCCompatible::PITObserver>::Channel::read
                    (this_00,CONCAT22(in_register_00000032,port),in_RDX,0x46bb18);
  return (uchar)sVar5;
}

Assistant:

IntT in([[maybe_unused]] uint16_t port) {
			switch(port) {
				default:
					printf("Unhandled in: %04x\n", port);
				break;

				case 0x0000:	return dma_.controller.read<0x0>();
				case 0x0001:	return dma_.controller.read<0x1>();
				case 0x0002:	return dma_.controller.read<0x2>();
				case 0x0003:	return dma_.controller.read<0x3>();
				case 0x0004:	return dma_.controller.read<0x4>();
				case 0x0005:	return dma_.controller.read<0x5>();
				case 0x0006:	return dma_.controller.read<0x6>();
				case 0x0007:	return dma_.controller.read<0x7>();
				case 0x0008:	return dma_.controller.read<0x8>();
				case 0x000d:	return dma_.controller.read<0xd>();

				case 0x0009:	case 0x000b:
				case 0x000c:	case 0x000f:
					// DMA area, but it doesn't respond.
				break;

				case 0x0020:	return pic_.read<0>();
				case 0x0021:	return pic_.read<1>();

				case 0x0040:	return pit_.read<0>();
				case 0x0041:	return pit_.read<1>();
				case 0x0042:	return pit_.read<2>();

				case 0x0060:	case 0x0061:	case 0x0062:	case 0x0063:
				case 0x0064:	case 0x0065:	case 0x0066:	case 0x0067:
				case 0x0068:	case 0x0069:	case 0x006a:	case 0x006b:
				case 0x006c:	case 0x006d:	case 0x006e:	case 0x006f:
				return ppi_.read(port);

				case 0x0071:	return rtc_.read();

				case 0x0080:	return dma_.pages.page<0>();
				case 0x0081:	return dma_.pages.page<1>();
				case 0x0082:	return dma_.pages.page<2>();
				case 0x0083:	return dma_.pages.page<3>();
				case 0x0084:	return dma_.pages.page<4>();
				case 0x0085:	return dma_.pages.page<5>();
				case 0x0086:	return dma_.pages.page<6>();
				case 0x0087:	return dma_.pages.page<7>();

				case 0x0201:	break;		// Ignore game port.

				case 0x0278:	case 0x0279:	case 0x027a:
				case 0x0378:	case 0x0379:	case 0x037a:
				case 0x03bc:	case 0x03bd:	case 0x03be:
					// Ignore parallel port accesses.
				break;

				case 0x03f4:	return fdc_.status();
				case 0x03f5:	return fdc_.read();

				case 0x03b8:
					if constexpr (video == Target::VideoAdaptor::MDA) {
						return video_.template read<0x8>();
					}
				break;

				case 0x3da:
					if constexpr (video == Target::VideoAdaptor::CGA) {
						return video_.template read<0xa>();
					}
				break;

				case 0x02e8:	case 0x02e9:	case 0x02ea:	case 0x02eb:
				case 0x02ec:	case 0x02ed:	case 0x02ee:	case 0x02ef:
				case 0x02f8:	case 0x02f9:	case 0x02fa:	case 0x02fb:
				case 0x02fc:	case 0x02fd:	case 0x02fe:	case 0x02ff:
				case 0x03e8:	case 0x03e9:	case 0x03ea:	case 0x03eb:
				case 0x03ec:	case 0x03ed:	case 0x03ee:	case 0x03ef:
				case 0x03f8:	case 0x03f9:	case 0x03fa:	case 0x03fb:
				case 0x03fc:	case 0x03fd:	case 0x03fe:	case 0x03ff:
					// Ignore serial port accesses.
				break;
			}
			return 0xff;
		}